

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse41_128_8.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_striped_profile_sse41_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 (*pauVar1) [16];
  byte *pbVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  uint dlen;
  undefined1 auVar6 [16];
  int iVar7;
  parasail_result_t *result;
  __m128i *palVar8;
  __m128i *palVar9;
  __m128i *b;
  ulong uVar10;
  __m128i *palVar11;
  bool bVar12;
  int iVar13;
  undefined4 in_register_0000000c;
  undefined8 uVar14;
  char *pcVar15;
  undefined8 extraout_RDX;
  ulong uVar16;
  char *__format;
  ulong uVar17;
  int iVar18;
  undefined8 in_R9;
  long lVar19;
  ulong size;
  ulong uVar20;
  byte bVar21;
  byte bVar26;
  byte bVar28;
  byte bVar30;
  byte bVar32;
  byte bVar34;
  byte bVar36;
  byte bVar38;
  byte bVar40;
  byte bVar42;
  byte bVar44;
  byte bVar46;
  byte bVar48;
  byte bVar50;
  byte bVar52;
  byte bVar54;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  char cVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  char cVar63;
  char cVar64;
  char cVar65;
  char cVar66;
  char cVar67;
  char cVar68;
  char cVar69;
  char cVar70;
  char cVar71;
  char cVar72;
  char cVar73;
  char cVar74;
  char cVar75;
  char cVar76;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  char cVar77;
  __m128i c;
  __m128i c_00;
  __m128i vH;
  __m128i vH_00;
  ulong local_118;
  uint local_10c;
  __m128i *local_108;
  undefined1 local_f8 [16];
  size_t len;
  longlong extraout_RDX_00;
  char cVar22;
  char cVar27;
  char cVar29;
  char cVar31;
  char cVar33;
  char cVar35;
  char cVar37;
  char cVar39;
  char cVar41;
  char cVar43;
  char cVar45;
  char cVar47;
  char cVar49;
  char cVar51;
  char cVar53;
  char cVar55;
  
  uVar17 = (ulong)(uint)s2Len;
  uVar14 = CONCAT44(in_register_0000000c,open);
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "profile";
  }
  else {
    pvVar4 = (profile->profile8).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar15 = "profile->profile8.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar15 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar15 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar15 = "open";
        }
        else {
          if (-1 < gap) {
            iVar13 = ppVar5->max;
            result = parasail_result_new_table1((uint)((ulong)uVar3 + 0xf) & 0x7ffffff0,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = (ulong)uVar3 + 0xf >> 4;
              result->flag = result->flag | 0x10120804;
              palVar8 = parasail_memalign___m128i(0x10,size);
              palVar9 = parasail_memalign___m128i(0x10,size);
              local_108 = parasail_memalign___m128i(0x10,size);
              b = parasail_memalign___m128i(0x10,size);
              bVar12 = palVar9 == (__m128i *)0x0 || palVar8 == (__m128i *)0x0;
              len = CONCAT71((int7)((ulong)uVar14 >> 8),bVar12);
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              local_118 = 0;
              c[1]._0_1_ = (b == (__m128i *)0x0 || local_108 == (__m128i *)0x0) || bVar12;
              if ((b != (__m128i *)0x0 && local_108 != (__m128i *)0x0) &&
                  (palVar9 != (__m128i *)0x0 && palVar8 != (__m128i *)0x0)) {
                auVar57 = pshufb(ZEXT416((uint)open),(undefined1  [16])0x0);
                auVar58 = pshufb(ZEXT416((uint)gap),(undefined1  [16])0x0);
                c[0] = size;
                parasail_memset___m128i(palVar8,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = size;
                parasail_memset___m128i(b,c_00,len);
                dlen = (uint)size;
                uVar10 = uVar17 & 0xffffffff;
                local_10c = 0x80;
                uVar20 = 0;
                auVar25 = _DAT_008a1f40;
                local_f8 = _DAT_008a1f40;
                do {
                  if (uVar20 == uVar10) {
LAB_0066de91:
                    iVar13 = (int)uVar17;
                    if ((char)local_10c == '\x7f') {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                    }
                    iVar7 = parasail_result_is_saturated(result);
                    palVar11 = local_108;
                    if (iVar7 == 0) {
                      if ((int)local_118 == iVar13 + -2) {
                        palVar11 = palVar9;
                      }
                      if ((int)local_118 == iVar13 + -1) {
                        palVar11 = palVar8;
                        palVar8 = local_108;
                      }
                      iVar7 = uVar3 - 1;
                      for (uVar17 = 0; (dlen & 0x7ffffff) << 4 != (uint)uVar17; uVar17 = uVar17 + 1)
                      {
                        if ((*(char *)((long)*palVar11 + uVar17) == (char)local_10c) &&
                           (iVar18 = ((uint)uVar17 & 0xf) * dlen + ((uint)(uVar17 >> 4) & 0xfffffff)
                           , iVar18 < iVar7)) {
                          iVar7 = iVar18;
                        }
                      }
                      if ((int)local_118 != iVar13 + -2) {
                        local_108 = palVar9;
                      }
                      if ((int)local_118 != iVar13 + -1) {
                        palVar9 = local_108;
                      }
                      iVar13 = (char)local_10c + 0x80;
                    }
                    else {
                      local_118._0_4_ = 0;
                      iVar13 = 0xff;
                      iVar7 = 0;
                    }
                    result->score = iVar13;
                    result->end_query = iVar7;
                    result->end_ref = (int)local_118;
                    parasail_free(b);
                    parasail_free(palVar11);
                    parasail_free(palVar9);
                    parasail_free(palVar8);
                    return result;
                  }
                  uVar16 = palVar8[dlen - 1][0];
                  auVar62._8_8_ = palVar8[dlen - 1][1] << 8 | uVar16 >> 0x38;
                  auVar62._0_8_ = uVar16 << 8 | 0x80;
                  iVar7 = ppVar5->mapper[(byte)s2[uVar20]];
                  iVar18 = (int)uVar20;
                  palVar11 = palVar9;
                  if ((int)local_118 == iVar18 + -2) {
                    palVar11 = local_108;
                  }
                  lVar19 = 0;
                  auVar59 = _DAT_008a1f40;
                  for (uVar16 = 0; size != uVar16; uVar16 = uVar16 + 1) {
                    auVar61 = paddsb(auVar62,*(undefined1 (*) [16])
                                              ((long)pvVar4 +
                                              lVar19 + (long)(int)(iVar7 * dlen) * 0x10));
                    pauVar1 = (undefined1 (*) [16])((long)*b + lVar19);
                    cVar43 = (*pauVar1)[0];
                    cVar45 = (*pauVar1)[1];
                    cVar47 = (*pauVar1)[2];
                    cVar51 = (*pauVar1)[3];
                    cVar49 = (*pauVar1)[4];
                    cVar55 = (*pauVar1)[5];
                    cVar53 = (*pauVar1)[6];
                    cVar22 = (*pauVar1)[7];
                    cVar27 = (*pauVar1)[8];
                    cVar29 = (*pauVar1)[9];
                    cVar31 = (*pauVar1)[10];
                    cVar33 = (*pauVar1)[0xb];
                    cVar35 = (*pauVar1)[0xc];
                    cVar37 = (*pauVar1)[0xd];
                    cVar39 = (*pauVar1)[0xe];
                    cVar56 = (*pauVar1)[0xf];
                    auVar62 = *pauVar1;
                    cVar41 = auVar59[0];
                    bVar21 = (cVar43 < cVar41) * cVar41 | (cVar43 >= cVar41) * cVar43;
                    cVar41 = auVar59[1];
                    bVar26 = (cVar45 < cVar41) * cVar41 | (cVar45 >= cVar41) * cVar45;
                    cVar41 = auVar59[2];
                    bVar28 = (cVar47 < cVar41) * cVar41 | (cVar47 >= cVar41) * cVar47;
                    cVar41 = auVar59[3];
                    bVar30 = (cVar51 < cVar41) * cVar41 | (cVar51 >= cVar41) * cVar51;
                    cVar41 = auVar59[4];
                    bVar32 = (cVar49 < cVar41) * cVar41 | (cVar49 >= cVar41) * cVar49;
                    cVar41 = auVar59[5];
                    bVar34 = (cVar55 < cVar41) * cVar41 | (cVar55 >= cVar41) * cVar55;
                    cVar41 = auVar59[6];
                    bVar36 = (cVar53 < cVar41) * cVar41 | (cVar53 >= cVar41) * cVar53;
                    cVar41 = auVar59[7];
                    bVar38 = (cVar22 < cVar41) * cVar41 | (cVar22 >= cVar41) * cVar22;
                    cVar41 = auVar59[8];
                    bVar40 = (cVar27 < cVar41) * cVar41 | (cVar27 >= cVar41) * cVar27;
                    cVar41 = auVar59[9];
                    bVar42 = (cVar29 < cVar41) * cVar41 | (cVar29 >= cVar41) * cVar29;
                    cVar41 = auVar59[10];
                    bVar44 = (cVar31 < cVar41) * cVar41 | (cVar31 >= cVar41) * cVar31;
                    cVar41 = auVar59[0xb];
                    bVar46 = (cVar33 < cVar41) * cVar41 | (cVar33 >= cVar41) * cVar33;
                    cVar41 = auVar59[0xc];
                    bVar48 = (cVar35 < cVar41) * cVar41 | (cVar35 >= cVar41) * cVar35;
                    cVar41 = auVar59[0xd];
                    bVar50 = (cVar37 < cVar41) * cVar41 | (cVar37 >= cVar41) * cVar37;
                    cVar41 = auVar59[0xe];
                    bVar52 = (cVar39 < cVar41) * cVar41 | (cVar39 >= cVar41) * cVar39;
                    cVar41 = auVar59[0xf];
                    bVar54 = (cVar56 < cVar41) * cVar41 | (cVar56 >= cVar41) * cVar56;
                    cVar41 = auVar61[0];
                    bVar21 = ((char)bVar21 < cVar41) * cVar41 | ((char)bVar21 >= cVar41) * bVar21;
                    cVar41 = auVar61[1];
                    bVar26 = ((char)bVar26 < cVar41) * cVar41 | ((char)bVar26 >= cVar41) * bVar26;
                    cVar41 = auVar61[2];
                    bVar28 = ((char)bVar28 < cVar41) * cVar41 | ((char)bVar28 >= cVar41) * bVar28;
                    cVar41 = auVar61[3];
                    bVar30 = ((char)bVar30 < cVar41) * cVar41 | ((char)bVar30 >= cVar41) * bVar30;
                    cVar41 = auVar61[4];
                    bVar32 = ((char)bVar32 < cVar41) * cVar41 | ((char)bVar32 >= cVar41) * bVar32;
                    cVar41 = auVar61[5];
                    bVar34 = ((char)bVar34 < cVar41) * cVar41 | ((char)bVar34 >= cVar41) * bVar34;
                    cVar41 = auVar61[6];
                    bVar36 = ((char)bVar36 < cVar41) * cVar41 | ((char)bVar36 >= cVar41) * bVar36;
                    cVar41 = auVar61[7];
                    bVar38 = ((char)bVar38 < cVar41) * cVar41 | ((char)bVar38 >= cVar41) * bVar38;
                    cVar41 = auVar61[8];
                    bVar40 = ((char)bVar40 < cVar41) * cVar41 | ((char)bVar40 >= cVar41) * bVar40;
                    cVar41 = auVar61[9];
                    bVar42 = ((char)bVar42 < cVar41) * cVar41 | ((char)bVar42 >= cVar41) * bVar42;
                    cVar41 = auVar61[10];
                    bVar44 = ((char)bVar44 < cVar41) * cVar41 | ((char)bVar44 >= cVar41) * bVar44;
                    cVar41 = auVar61[0xb];
                    bVar46 = ((char)bVar46 < cVar41) * cVar41 | ((char)bVar46 >= cVar41) * bVar46;
                    cVar41 = auVar61[0xc];
                    bVar48 = ((char)bVar48 < cVar41) * cVar41 | ((char)bVar48 >= cVar41) * bVar48;
                    cVar41 = auVar61[0xd];
                    bVar50 = ((char)bVar50 < cVar41) * cVar41 | ((char)bVar50 >= cVar41) * bVar50;
                    cVar41 = auVar61[0xe];
                    bVar52 = ((char)bVar52 < cVar41) * cVar41 | ((char)bVar52 >= cVar41) * bVar52;
                    cVar41 = auVar61[0xf];
                    bVar54 = ((char)bVar54 < cVar41) * cVar41 | ((char)bVar54 >= cVar41) * bVar54;
                    pbVar2 = (byte *)((long)*palVar11 + lVar19);
                    *pbVar2 = bVar21;
                    pbVar2[1] = bVar26;
                    pbVar2[2] = bVar28;
                    pbVar2[3] = bVar30;
                    pbVar2[4] = bVar32;
                    pbVar2[5] = bVar34;
                    pbVar2[6] = bVar36;
                    pbVar2[7] = bVar38;
                    pbVar2[8] = bVar40;
                    pbVar2[9] = bVar42;
                    pbVar2[10] = bVar44;
                    pbVar2[0xb] = bVar46;
                    pbVar2[0xc] = bVar48;
                    pbVar2[0xd] = bVar50;
                    pbVar2[0xe] = bVar52;
                    pbVar2[0xf] = bVar54;
                    vH[0] = uVar16 & 0xffffffff;
                    vH[1] = size;
                    arr_store_si128(((result->field_4).rowcols)->score_row,vH,iVar18,(int32_t)uVar17
                                    ,(int32_t)in_R9,dlen,(int32_t)uVar17);
                    auVar61[1] = bVar26;
                    auVar61[0] = bVar21;
                    auVar61[2] = bVar28;
                    auVar61[3] = bVar30;
                    auVar61[4] = bVar32;
                    auVar61[5] = bVar34;
                    auVar61[6] = bVar36;
                    auVar61[7] = bVar38;
                    auVar61[8] = bVar40;
                    auVar61[9] = bVar42;
                    auVar61[10] = bVar44;
                    auVar61[0xb] = bVar46;
                    auVar61[0xc] = bVar48;
                    auVar61[0xd] = bVar50;
                    auVar61[0xe] = bVar52;
                    auVar61[0xf] = bVar54;
                    local_f8[1] = ((char)local_f8[1] < (char)bVar26) * bVar26 |
                                  ((char)local_f8[1] >= (char)bVar26) * local_f8[1];
                    local_f8[0] = ((char)local_f8[0] < (char)bVar21) * bVar21 |
                                  ((char)local_f8[0] >= (char)bVar21) * local_f8[0];
                    local_f8[2] = ((char)local_f8[2] < (char)bVar28) * bVar28 |
                                  ((char)local_f8[2] >= (char)bVar28) * local_f8[2];
                    local_f8[3] = ((char)local_f8[3] < (char)bVar30) * bVar30 |
                                  ((char)local_f8[3] >= (char)bVar30) * local_f8[3];
                    local_f8[4] = ((char)local_f8[4] < (char)bVar32) * bVar32 |
                                  ((char)local_f8[4] >= (char)bVar32) * local_f8[4];
                    local_f8[5] = ((char)local_f8[5] < (char)bVar34) * bVar34 |
                                  ((char)local_f8[5] >= (char)bVar34) * local_f8[5];
                    local_f8[6] = ((char)local_f8[6] < (char)bVar36) * bVar36 |
                                  ((char)local_f8[6] >= (char)bVar36) * local_f8[6];
                    local_f8[7] = ((char)local_f8[7] < (char)bVar38) * bVar38 |
                                  ((char)local_f8[7] >= (char)bVar38) * local_f8[7];
                    local_f8[8] = ((char)local_f8[8] < (char)bVar40) * bVar40 |
                                  ((char)local_f8[8] >= (char)bVar40) * local_f8[8];
                    local_f8[9] = ((char)local_f8[9] < (char)bVar42) * bVar42 |
                                  ((char)local_f8[9] >= (char)bVar42) * local_f8[9];
                    local_f8[10] = ((char)local_f8[10] < (char)bVar44) * bVar44 |
                                   ((char)local_f8[10] >= (char)bVar44) * local_f8[10];
                    local_f8[0xb] =
                         ((char)local_f8[0xb] < (char)bVar46) * bVar46 |
                         ((char)local_f8[0xb] >= (char)bVar46) * local_f8[0xb];
                    local_f8[0xc] =
                         ((char)local_f8[0xc] < (char)bVar48) * bVar48 |
                         ((char)local_f8[0xc] >= (char)bVar48) * local_f8[0xc];
                    local_f8[0xd] =
                         ((char)local_f8[0xd] < (char)bVar50) * bVar50 |
                         ((char)local_f8[0xd] >= (char)bVar50) * local_f8[0xd];
                    local_f8[0xe] =
                         ((char)local_f8[0xe] < (char)bVar52) * bVar52 |
                         ((char)local_f8[0xe] >= (char)bVar52) * local_f8[0xe];
                    local_f8[0xf] =
                         ((char)local_f8[0xf] < (char)bVar54) * bVar54 |
                         ((char)local_f8[0xf] >= (char)bVar54) * local_f8[0xf];
                    auVar61 = psubsb(auVar61,auVar57);
                    auVar62 = psubsb(auVar62,auVar58);
                    cVar41 = auVar61[0];
                    cVar56 = auVar62[0];
                    cVar43 = auVar61[1];
                    cVar63 = auVar62[1];
                    cVar45 = auVar61[2];
                    cVar64 = auVar62[2];
                    cVar47 = auVar61[3];
                    cVar65 = auVar62[3];
                    cVar51 = auVar61[4];
                    cVar66 = auVar62[4];
                    cVar49 = auVar61[5];
                    cVar67 = auVar62[5];
                    cVar55 = auVar61[6];
                    cVar68 = auVar62[6];
                    cVar53 = auVar61[7];
                    cVar69 = auVar62[7];
                    cVar22 = auVar61[8];
                    cVar70 = auVar62[8];
                    cVar27 = auVar61[9];
                    cVar71 = auVar62[9];
                    cVar29 = auVar61[10];
                    cVar72 = auVar62[10];
                    cVar31 = auVar61[0xb];
                    cVar73 = auVar62[0xb];
                    cVar33 = auVar61[0xc];
                    cVar74 = auVar62[0xc];
                    cVar35 = auVar61[0xd];
                    cVar75 = auVar62[0xd];
                    cVar37 = auVar61[0xe];
                    cVar76 = auVar62[0xe];
                    cVar77 = auVar62[0xf];
                    cVar39 = auVar61[0xf];
                    pbVar2 = (byte *)((long)*b + lVar19);
                    *pbVar2 = (cVar56 < cVar41) * cVar41 | (cVar56 >= cVar41) * cVar56;
                    pbVar2[1] = (cVar63 < cVar43) * cVar43 | (cVar63 >= cVar43) * cVar63;
                    pbVar2[2] = (cVar64 < cVar45) * cVar45 | (cVar64 >= cVar45) * cVar64;
                    pbVar2[3] = (cVar65 < cVar47) * cVar47 | (cVar65 >= cVar47) * cVar65;
                    pbVar2[4] = (cVar66 < cVar51) * cVar51 | (cVar66 >= cVar51) * cVar66;
                    pbVar2[5] = (cVar67 < cVar49) * cVar49 | (cVar67 >= cVar49) * cVar67;
                    pbVar2[6] = (cVar68 < cVar55) * cVar55 | (cVar68 >= cVar55) * cVar68;
                    pbVar2[7] = (cVar69 < cVar53) * cVar53 | (cVar69 >= cVar53) * cVar69;
                    pbVar2[8] = (cVar70 < cVar22) * cVar22 | (cVar70 >= cVar22) * cVar70;
                    pbVar2[9] = (cVar71 < cVar27) * cVar27 | (cVar71 >= cVar27) * cVar71;
                    pbVar2[10] = (cVar72 < cVar29) * cVar29 | (cVar72 >= cVar29) * cVar72;
                    pbVar2[0xb] = (cVar73 < cVar31) * cVar31 | (cVar73 >= cVar31) * cVar73;
                    pbVar2[0xc] = (cVar74 < cVar33) * cVar33 | (cVar74 >= cVar33) * cVar74;
                    pbVar2[0xd] = (cVar75 < cVar35) * cVar35 | (cVar75 >= cVar35) * cVar75;
                    pbVar2[0xe] = (cVar76 < cVar37) * cVar37 | (cVar76 >= cVar37) * cVar76;
                    pbVar2[0xf] = (cVar77 < cVar39) * cVar39 | (cVar77 >= cVar39) * cVar77;
                    auVar62 = psubsb(auVar59,auVar58);
                    cVar56 = auVar62[0];
                    auVar59[0] = (cVar56 < cVar41) * cVar41 | (cVar56 >= cVar41) * cVar56;
                    cVar41 = auVar62[1];
                    auVar59[1] = (cVar41 < cVar43) * cVar43 | (cVar41 >= cVar43) * cVar41;
                    cVar41 = auVar62[2];
                    auVar59[2] = (cVar41 < cVar45) * cVar45 | (cVar41 >= cVar45) * cVar41;
                    cVar41 = auVar62[3];
                    auVar59[3] = (cVar41 < cVar47) * cVar47 | (cVar41 >= cVar47) * cVar41;
                    cVar41 = auVar62[4];
                    auVar59[4] = (cVar41 < cVar51) * cVar51 | (cVar41 >= cVar51) * cVar41;
                    cVar41 = auVar62[5];
                    auVar59[5] = (cVar41 < cVar49) * cVar49 | (cVar41 >= cVar49) * cVar41;
                    cVar41 = auVar62[6];
                    auVar59[6] = (cVar41 < cVar55) * cVar55 | (cVar41 >= cVar55) * cVar41;
                    cVar41 = auVar62[7];
                    auVar59[7] = (cVar41 < cVar53) * cVar53 | (cVar41 >= cVar53) * cVar41;
                    cVar41 = auVar62[8];
                    auVar59[8] = (cVar41 < cVar22) * cVar22 | (cVar41 >= cVar22) * cVar41;
                    cVar41 = auVar62[9];
                    auVar59[9] = (cVar41 < cVar27) * cVar27 | (cVar41 >= cVar27) * cVar41;
                    cVar41 = auVar62[10];
                    auVar59[10] = (cVar41 < cVar29) * cVar29 | (cVar41 >= cVar29) * cVar41;
                    cVar41 = auVar62[0xb];
                    auVar59[0xb] = (cVar41 < cVar31) * cVar31 | (cVar41 >= cVar31) * cVar41;
                    cVar41 = auVar62[0xc];
                    auVar59[0xc] = (cVar41 < cVar33) * cVar33 | (cVar41 >= cVar33) * cVar41;
                    cVar41 = auVar62[0xd];
                    auVar59[0xd] = (cVar41 < cVar35) * cVar35 | (cVar41 >= cVar35) * cVar41;
                    cVar41 = auVar62[0xe];
                    cVar43 = auVar62[0xf];
                    auVar59[0xe] = (cVar41 < cVar37) * cVar37 | (cVar41 >= cVar37) * cVar41;
                    auVar59[0xf] = (cVar43 < cVar39) * cVar39 | (cVar43 >= cVar39) * cVar43;
                    auVar62 = *(undefined1 (*) [16])((long)*palVar8 + lVar19);
                    lVar19 = lVar19 + 0x10;
                  }
                  if ((int)local_118 == iVar18 + -2) {
                    local_108 = palVar9;
                  }
                  for (iVar7 = 0; iVar7 != 0x10; iVar7 = iVar7 + 1) {
                    uVar16 = auVar59._0_8_;
                    auVar59._8_8_ = auVar59._8_8_ << 8 | uVar16 >> 0x38;
                    auVar59._0_8_ = uVar16 << 8 | 0x80;
                    uVar16 = 0;
                    palVar9 = palVar11;
                    while (size != uVar16) {
                      cVar43 = (char)(*palVar9)[0];
                      cVar45 = *(char *)((long)*palVar9 + 1);
                      cVar47 = *(char *)((long)*palVar9 + 2);
                      cVar51 = *(char *)((long)*palVar9 + 3);
                      cVar49 = *(char *)((long)*palVar9 + 4);
                      cVar55 = *(char *)((long)*palVar9 + 5);
                      cVar53 = *(char *)((long)*palVar9 + 6);
                      cVar22 = *(char *)((long)*palVar9 + 7);
                      cVar27 = (char)(*palVar9)[1];
                      cVar29 = *(char *)((long)*palVar9 + 9);
                      cVar31 = *(char *)((long)*palVar9 + 10);
                      cVar33 = *(char *)((long)*palVar9 + 0xb);
                      cVar35 = *(char *)((long)*palVar9 + 0xc);
                      cVar37 = *(char *)((long)*palVar9 + 0xd);
                      cVar39 = *(char *)((long)*palVar9 + 0xe);
                      cVar56 = *(char *)((long)*palVar9 + 0xf);
                      cVar41 = auVar59[0];
                      bVar21 = (cVar43 < cVar41) * cVar41 | (cVar43 >= cVar41) * cVar43;
                      cVar41 = auVar59[1];
                      bVar26 = (cVar45 < cVar41) * cVar41 | (cVar45 >= cVar41) * cVar45;
                      cVar41 = auVar59[2];
                      bVar28 = (cVar47 < cVar41) * cVar41 | (cVar47 >= cVar41) * cVar47;
                      cVar41 = auVar59[3];
                      bVar30 = (cVar51 < cVar41) * cVar41 | (cVar51 >= cVar41) * cVar51;
                      cVar41 = auVar59[4];
                      bVar32 = (cVar49 < cVar41) * cVar41 | (cVar49 >= cVar41) * cVar49;
                      cVar41 = auVar59[5];
                      bVar34 = (cVar55 < cVar41) * cVar41 | (cVar55 >= cVar41) * cVar55;
                      cVar41 = auVar59[6];
                      bVar36 = (cVar53 < cVar41) * cVar41 | (cVar53 >= cVar41) * cVar53;
                      cVar41 = auVar59[7];
                      bVar38 = (cVar22 < cVar41) * cVar41 | (cVar22 >= cVar41) * cVar22;
                      cVar41 = auVar59[8];
                      bVar40 = (cVar27 < cVar41) * cVar41 | (cVar27 >= cVar41) * cVar27;
                      cVar41 = auVar59[9];
                      bVar42 = (cVar29 < cVar41) * cVar41 | (cVar29 >= cVar41) * cVar29;
                      cVar41 = auVar59[10];
                      bVar44 = (cVar31 < cVar41) * cVar41 | (cVar31 >= cVar41) * cVar31;
                      cVar41 = auVar59[0xb];
                      bVar46 = (cVar33 < cVar41) * cVar41 | (cVar33 >= cVar41) * cVar33;
                      cVar41 = auVar59[0xc];
                      bVar48 = (cVar35 < cVar41) * cVar41 | (cVar35 >= cVar41) * cVar35;
                      cVar41 = auVar59[0xd];
                      bVar50 = (cVar37 < cVar41) * cVar41 | (cVar37 >= cVar41) * cVar37;
                      cVar41 = auVar59[0xe];
                      bVar52 = (cVar39 < cVar41) * cVar41 | (cVar39 >= cVar41) * cVar39;
                      cVar41 = auVar59[0xf];
                      bVar54 = (cVar56 < cVar41) * cVar41 | (cVar56 >= cVar41) * cVar56;
                      *(byte *)*palVar9 = bVar21;
                      *(byte *)((long)*palVar9 + 1) = bVar26;
                      *(byte *)((long)*palVar9 + 2) = bVar28;
                      *(byte *)((long)*palVar9 + 3) = bVar30;
                      *(byte *)((long)*palVar9 + 4) = bVar32;
                      *(byte *)((long)*palVar9 + 5) = bVar34;
                      *(byte *)((long)*palVar9 + 6) = bVar36;
                      *(byte *)((long)*palVar9 + 7) = bVar38;
                      *(byte *)(*palVar9 + 1) = bVar40;
                      *(byte *)((long)*palVar9 + 9) = bVar42;
                      *(byte *)((long)*palVar9 + 10) = bVar44;
                      *(byte *)((long)*palVar9 + 0xb) = bVar46;
                      *(byte *)((long)*palVar9 + 0xc) = bVar48;
                      *(byte *)((long)*palVar9 + 0xd) = bVar50;
                      *(byte *)((long)*palVar9 + 0xe) = bVar52;
                      *(byte *)((long)*palVar9 + 0xf) = bVar54;
                      vH_00[0] = uVar16 & 0xffffffff;
                      vH_00[1] = size;
                      arr_store_si128(((result->field_4).rowcols)->score_row,vH_00,iVar18,
                                      (int32_t)uVar17,(int32_t)in_R9,dlen,(int32_t)uVar17);
                      auVar6[1] = bVar26;
                      auVar6[0] = bVar21;
                      auVar6[2] = bVar28;
                      auVar6[3] = bVar30;
                      auVar6[4] = bVar32;
                      auVar6[5] = bVar34;
                      auVar6[6] = bVar36;
                      auVar6[7] = bVar38;
                      auVar6[8] = bVar40;
                      auVar6[9] = bVar42;
                      auVar6[10] = bVar44;
                      auVar6[0xb] = bVar46;
                      auVar6[0xc] = bVar48;
                      auVar6[0xd] = bVar50;
                      auVar6[0xe] = bVar52;
                      auVar6[0xf] = bVar54;
                      local_f8[0] = ((char)local_f8[0] < (char)bVar21) * bVar21 |
                                    ((char)local_f8[0] >= (char)bVar21) * local_f8[0];
                      local_f8[1] = ((char)local_f8[1] < (char)bVar26) * bVar26 |
                                    ((char)local_f8[1] >= (char)bVar26) * local_f8[1];
                      local_f8[2] = ((char)local_f8[2] < (char)bVar28) * bVar28 |
                                    ((char)local_f8[2] >= (char)bVar28) * local_f8[2];
                      local_f8[3] = ((char)local_f8[3] < (char)bVar30) * bVar30 |
                                    ((char)local_f8[3] >= (char)bVar30) * local_f8[3];
                      local_f8[4] = ((char)local_f8[4] < (char)bVar32) * bVar32 |
                                    ((char)local_f8[4] >= (char)bVar32) * local_f8[4];
                      local_f8[5] = ((char)local_f8[5] < (char)bVar34) * bVar34 |
                                    ((char)local_f8[5] >= (char)bVar34) * local_f8[5];
                      local_f8[6] = ((char)local_f8[6] < (char)bVar36) * bVar36 |
                                    ((char)local_f8[6] >= (char)bVar36) * local_f8[6];
                      local_f8[7] = ((char)local_f8[7] < (char)bVar38) * bVar38 |
                                    ((char)local_f8[7] >= (char)bVar38) * local_f8[7];
                      local_f8[8] = ((char)local_f8[8] < (char)bVar40) * bVar40 |
                                    ((char)local_f8[8] >= (char)bVar40) * local_f8[8];
                      local_f8[9] = ((char)local_f8[9] < (char)bVar42) * bVar42 |
                                    ((char)local_f8[9] >= (char)bVar42) * local_f8[9];
                      local_f8[10] = ((char)local_f8[10] < (char)bVar44) * bVar44 |
                                     ((char)local_f8[10] >= (char)bVar44) * local_f8[10];
                      local_f8[0xb] =
                           ((char)local_f8[0xb] < (char)bVar46) * bVar46 |
                           ((char)local_f8[0xb] >= (char)bVar46) * local_f8[0xb];
                      local_f8[0xc] =
                           ((char)local_f8[0xc] < (char)bVar48) * bVar48 |
                           ((char)local_f8[0xc] >= (char)bVar48) * local_f8[0xc];
                      local_f8[0xd] =
                           ((char)local_f8[0xd] < (char)bVar50) * bVar50 |
                           ((char)local_f8[0xd] >= (char)bVar50) * local_f8[0xd];
                      local_f8[0xe] =
                           ((char)local_f8[0xe] < (char)bVar52) * bVar52 |
                           ((char)local_f8[0xe] >= (char)bVar52) * local_f8[0xe];
                      local_f8[0xf] =
                           ((char)local_f8[0xf] < (char)bVar54) * bVar54 |
                           ((char)local_f8[0xf] >= (char)bVar54) * local_f8[0xf];
                      auVar62 = psubsb(auVar6,auVar57);
                      auVar59 = psubsb(auVar59,auVar58);
                      auVar23[0] = -(auVar62[0] < auVar59[0]);
                      auVar23[1] = -(auVar62[1] < auVar59[1]);
                      auVar23[2] = -(auVar62[2] < auVar59[2]);
                      auVar23[3] = -(auVar62[3] < auVar59[3]);
                      auVar23[4] = -(auVar62[4] < auVar59[4]);
                      auVar23[5] = -(auVar62[5] < auVar59[5]);
                      auVar23[6] = -(auVar62[6] < auVar59[6]);
                      auVar23[7] = -(auVar62[7] < auVar59[7]);
                      auVar23[8] = -(auVar62[8] < auVar59[8]);
                      auVar23[9] = -(auVar62[9] < auVar59[9]);
                      auVar23[10] = -(auVar62[10] < auVar59[10]);
                      auVar23[0xb] = -(auVar62[0xb] < auVar59[0xb]);
                      auVar23[0xc] = -(auVar62[0xc] < auVar59[0xc]);
                      auVar23[0xd] = -(auVar62[0xd] < auVar59[0xd]);
                      auVar23[0xe] = -(auVar62[0xe] < auVar59[0xe]);
                      bVar12 = auVar62[0xf] < auVar59[0xf];
                      auVar23[0xf] = -bVar12;
                      uVar16 = uVar16 + 1;
                      palVar9 = palVar9 + 1;
                      if ((((((((((((((((auVar23 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar23 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar23 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar23 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar23 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar23 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar23 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar23 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar23 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar23 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar23 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar23 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar23 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar23 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar23 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          !bVar12) goto LAB_0066ddc8;
                    }
                  }
LAB_0066ddc8:
                  cVar22 = local_f8[0];
                  auVar24[0] = -(auVar25[0] < cVar22);
                  cVar27 = local_f8[1];
                  auVar24[1] = -(auVar25[1] < cVar27);
                  cVar29 = local_f8[2];
                  auVar24[2] = -(auVar25[2] < cVar29);
                  cVar31 = local_f8[3];
                  auVar24[3] = -(auVar25[3] < cVar31);
                  cVar33 = local_f8[4];
                  auVar24[4] = -(auVar25[4] < cVar33);
                  cVar35 = local_f8[5];
                  auVar24[5] = -(auVar25[5] < cVar35);
                  cVar37 = local_f8[6];
                  auVar24[6] = -(auVar25[6] < cVar37);
                  cVar39 = local_f8[7];
                  auVar24[7] = -(auVar25[7] < cVar39);
                  cVar41 = local_f8[8];
                  auVar24[8] = -(auVar25[8] < cVar41);
                  cVar43 = local_f8[9];
                  auVar24[9] = -(auVar25[9] < cVar43);
                  cVar45 = local_f8[10];
                  auVar24[10] = -(auVar25[10] < cVar45);
                  cVar47 = local_f8[0xb];
                  auVar24[0xb] = -(auVar25[0xb] < cVar47);
                  cVar49 = local_f8[0xc];
                  auVar24[0xc] = -(auVar25[0xc] < cVar49);
                  cVar51 = local_f8[0xd];
                  auVar24[0xd] = -(auVar25[0xd] < cVar51);
                  cVar53 = local_f8[0xe];
                  cVar55 = local_f8[0xf];
                  auVar24[0xe] = -(auVar25[0xe] < cVar53);
                  bVar12 = auVar25[0xf] < cVar55;
                  auVar24[0xf] = -bVar12;
                  palVar9 = palVar8;
                  palVar8 = palVar11;
                  if ((((((((((((((((auVar24 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar24 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar24 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar24 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar24 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar24 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar24 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar24 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar24 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar24 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar24 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar24 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar24 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar12)
                  {
                    auVar25 = local_f8 ^ _DAT_008a2460;
                    bVar21 = auVar25[0];
                    bVar26 = auVar25[1];
                    auVar60[0] = (bVar21 < bVar26) * bVar21 | (bVar21 >= bVar26) * bVar26;
                    auVar60[1] = 0;
                    bVar21 = auVar25[2];
                    bVar26 = auVar25[3];
                    auVar60[2] = (bVar21 < bVar26) * bVar21 | (bVar21 >= bVar26) * bVar26;
                    auVar60[3] = 0;
                    bVar21 = auVar25[4];
                    bVar26 = auVar25[5];
                    auVar60[4] = (bVar21 < bVar26) * bVar21 | (bVar21 >= bVar26) * bVar26;
                    auVar60[5] = 0;
                    bVar21 = auVar25[6];
                    bVar26 = auVar25[7];
                    auVar60[6] = (bVar21 < bVar26) * bVar21 | (bVar21 >= bVar26) * bVar26;
                    auVar60[7] = 0;
                    bVar21 = auVar25[8];
                    bVar26 = auVar25[9];
                    auVar60[8] = (bVar21 < bVar26) * bVar21 | (bVar21 >= bVar26) * bVar26;
                    auVar60[9] = 0;
                    bVar21 = auVar25[10];
                    bVar26 = auVar25[0xb];
                    auVar60[10] = (bVar21 < bVar26) * bVar21 | (bVar21 >= bVar26) * bVar26;
                    auVar60[0xb] = 0;
                    bVar21 = auVar25[0xc];
                    bVar26 = auVar25[0xd];
                    auVar60[0xc] = (bVar21 < bVar26) * bVar21 | (bVar21 >= bVar26) * bVar26;
                    auVar60[0xd] = 0;
                    bVar21 = auVar25[0xe];
                    bVar26 = auVar25[0xf];
                    auVar60[0xe] = (bVar21 < bVar26) * bVar21 | (bVar21 >= bVar26) * bVar26;
                    auVar60[0xf] = 0;
                    auVar25 = phminposuw(auVar60);
                    local_10c = auVar25._0_4_ ^ 0x7f;
                    if ((char)('~' - (char)iVar13) < (char)local_10c) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      uVar17 = uVar20;
                      goto LAB_0066de91;
                    }
                    bVar21 = (cVar41 < cVar22) * cVar22 | (cVar41 >= cVar22) * cVar41;
                    bVar26 = (cVar43 < cVar27) * cVar27 | (cVar43 >= cVar27) * cVar43;
                    bVar28 = (cVar45 < cVar29) * cVar29 | (cVar45 >= cVar29) * cVar45;
                    bVar30 = (cVar47 < cVar31) * cVar31 | (cVar47 >= cVar31) * cVar47;
                    bVar32 = (cVar49 < cVar33) * cVar33 | (cVar49 >= cVar33) * cVar49;
                    bVar34 = (cVar51 < cVar35) * cVar35 | (cVar51 >= cVar35) * cVar51;
                    bVar36 = (cVar53 < cVar37) * cVar37 | (cVar53 >= cVar37) * cVar53;
                    bVar38 = (cVar55 < cVar39) * cVar39 | (cVar55 >= cVar39) * cVar55;
                    cVar41 = ('\0' < cVar41) * cVar41;
                    cVar43 = ('\0' < cVar43) * cVar43;
                    cVar45 = ('\0' < cVar45) * cVar45;
                    cVar47 = ('\0' < cVar47) * cVar47;
                    cVar49 = ('\0' < cVar49) * cVar49;
                    cVar51 = ('\0' < cVar51) * cVar51;
                    cVar53 = ('\0' < cVar53) * cVar53;
                    cVar55 = ('\0' < cVar55) * cVar55;
                    bVar21 = ((char)bVar32 < (char)bVar21) * bVar21 |
                             ((char)bVar32 >= (char)bVar21) * bVar32;
                    bVar26 = ((char)bVar34 < (char)bVar26) * bVar26 |
                             ((char)bVar34 >= (char)bVar26) * bVar34;
                    bVar28 = ((char)bVar36 < (char)bVar28) * bVar28 |
                             ((char)bVar36 >= (char)bVar28) * bVar36;
                    bVar30 = ((char)bVar38 < (char)bVar30) * bVar30 |
                             ((char)bVar38 >= (char)bVar30) * bVar38;
                    bVar32 = (cVar41 < (char)bVar32) * bVar32 | (cVar41 >= (char)bVar32) * cVar41;
                    bVar34 = (cVar43 < (char)bVar34) * bVar34 | (cVar43 >= (char)bVar34) * cVar43;
                    bVar36 = (cVar45 < (char)bVar36) * bVar36 | (cVar45 >= (char)bVar36) * cVar45;
                    bVar38 = (cVar47 < (char)bVar38) * bVar38 | (cVar47 >= (char)bVar38) * cVar47;
                    bVar40 = (cVar49 < cVar41) * cVar41 | (cVar49 >= cVar41) * cVar49;
                    bVar42 = (cVar51 < cVar43) * cVar43 | (cVar51 >= cVar43) * cVar51;
                    bVar44 = (cVar53 < cVar45) * cVar45 | (cVar53 >= cVar45) * cVar53;
                    bVar46 = (cVar55 < cVar47) * cVar47 | (cVar55 >= cVar47) * cVar55;
                    cVar49 = ('\0' < cVar49) * cVar49;
                    cVar51 = ('\0' < cVar51) * cVar51;
                    cVar53 = ('\0' < cVar53) * cVar53;
                    cVar55 = ('\0' < cVar55) * cVar55;
                    bVar21 = ((char)bVar28 < (char)bVar21) * bVar21 |
                             ((char)bVar28 >= (char)bVar21) * bVar28;
                    bVar26 = ((char)bVar30 < (char)bVar26) * bVar26 |
                             ((char)bVar30 >= (char)bVar26) * bVar30;
                    bVar28 = ((char)bVar32 < (char)bVar28) * bVar28 |
                             ((char)bVar32 >= (char)bVar28) * bVar32;
                    bVar30 = ((char)bVar34 < (char)bVar30) * bVar30 |
                             ((char)bVar34 >= (char)bVar30) * bVar34;
                    bVar32 = ((char)bVar36 < (char)bVar32) * bVar32 |
                             ((char)bVar36 >= (char)bVar32) * bVar36;
                    bVar34 = ((char)bVar38 < (char)bVar34) * bVar34 |
                             ((char)bVar38 >= (char)bVar34) * bVar38;
                    bVar36 = ((char)bVar40 < (char)bVar36) * bVar36 |
                             ((char)bVar40 >= (char)bVar36) * bVar40;
                    bVar38 = ((char)bVar42 < (char)bVar38) * bVar38 |
                             ((char)bVar42 >= (char)bVar38) * bVar42;
                    bVar40 = ((char)bVar44 < (char)bVar40) * bVar40 |
                             ((char)bVar44 >= (char)bVar40) * bVar44;
                    bVar42 = ((char)bVar46 < (char)bVar42) * bVar42 |
                             ((char)bVar46 >= (char)bVar42) * bVar46;
                    bVar44 = (cVar49 < (char)bVar44) * bVar44 | (cVar49 >= (char)bVar44) * cVar49;
                    bVar46 = (cVar51 < (char)bVar46) * bVar46 | (cVar51 >= (char)bVar46) * cVar51;
                    bVar48 = (cVar53 < cVar49) * cVar49 | (cVar53 >= cVar49) * cVar53;
                    bVar50 = (cVar55 < cVar51) * cVar51 | (cVar55 >= cVar51) * cVar55;
                    cVar53 = ('\0' < cVar53) * cVar53;
                    cVar55 = ('\0' < cVar55) * cVar55;
                    auVar25[0] = ((char)bVar26 < (char)bVar21) * bVar21 |
                                 ((char)bVar26 >= (char)bVar21) * bVar26;
                    auVar25[1] = ((char)bVar28 < (char)bVar26) * bVar26 |
                                 ((char)bVar28 >= (char)bVar26) * bVar28;
                    auVar25[2] = ((char)bVar30 < (char)bVar28) * bVar28 |
                                 ((char)bVar30 >= (char)bVar28) * bVar30;
                    auVar25[3] = ((char)bVar32 < (char)bVar30) * bVar30 |
                                 ((char)bVar32 >= (char)bVar30) * bVar32;
                    auVar25[4] = ((char)bVar34 < (char)bVar32) * bVar32 |
                                 ((char)bVar34 >= (char)bVar32) * bVar34;
                    auVar25[5] = ((char)bVar36 < (char)bVar34) * bVar34 |
                                 ((char)bVar36 >= (char)bVar34) * bVar36;
                    auVar25[6] = ((char)bVar38 < (char)bVar36) * bVar36 |
                                 ((char)bVar38 >= (char)bVar36) * bVar38;
                    auVar25[7] = ((char)bVar40 < (char)bVar38) * bVar38 |
                                 ((char)bVar40 >= (char)bVar38) * bVar40;
                    auVar25[8] = ((char)bVar42 < (char)bVar40) * bVar40 |
                                 ((char)bVar42 >= (char)bVar40) * bVar42;
                    auVar25[9] = ((char)bVar44 < (char)bVar42) * bVar42 |
                                 ((char)bVar44 >= (char)bVar42) * bVar44;
                    auVar25[10] = ((char)bVar46 < (char)bVar44) * bVar44 |
                                  ((char)bVar46 >= (char)bVar44) * bVar46;
                    auVar25[0xb] = ((char)bVar48 < (char)bVar46) * bVar46 |
                                   ((char)bVar48 >= (char)bVar46) * bVar48;
                    auVar25[0xc] = ((char)bVar50 < (char)bVar48) * bVar48 |
                                   ((char)bVar50 >= (char)bVar48) * bVar50;
                    auVar25[0xd] = (cVar53 < (char)bVar50) * bVar50 |
                                   (cVar53 >= (char)bVar50) * cVar53;
                    auVar25[0xe] = (cVar55 < cVar53) * cVar53 | (cVar55 >= cVar53) * cVar55;
                    auVar25[0xf] = ('\0' < cVar55) * cVar55;
                    auVar25 = pshufb(auVar25,_DAT_008a1b80);
                    local_118 = uVar20 & 0xffffffff;
                  }
                  uVar20 = uVar20 + 1;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar15 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_striped_profile_sse41_128_8",pcVar15);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int8_t bias = 0;
    int8_t score = 0;
    __m128i vBias;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int8_t maxp = 0;
    __m128i insert_mask;
    /*int8_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    vZero = _mm_set1_epi8(0);
    bias = INT8_MIN;
    score = bias;
    vBias = _mm_set1_epi8(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT8_MAX - (int8_t)(matrix->max+1);
    insert_mask = _mm_cmpgt_epi8(
            _mm_set_epi8(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT8_MAX : (int8_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vBias, segLen);
    parasail_memset___m128i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm_slli_si128(pvHStore[segLen - 1], 1);
        vH = _mm_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi8(vH, vE);
            vH = _mm_max_epi8(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm_max_epi8(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_subs_epi8(vH, vGapO);
            vE = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 1);
            vF = _mm_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm_max_epi8(vH, vMaxH);
                vH = _mm_subs_epi8(vH, vGapO);
                vF = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8 (vH, 15) - bias;
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi8(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi8_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi8(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT8_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT8_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int8_t *t = (int8_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}